

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,initializer_list<int> ranges)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  char cVar5;
  const_iterator range;
  bool bVar6;
  
  piVar4 = ranges._M_array;
  cVar5 = (char)this + 'H';
  std::__cxx11::string::push_back(cVar5);
  bVar6 = ranges._M_len == 0;
  if (!bVar6) {
    piVar2 = piVar4 + ranges._M_len;
    do {
      get(this);
      if (this->current < *piVar4) {
        bVar3 = false;
      }
      else {
        piVar1 = piVar4 + 1;
        piVar4 = piVar4 + 1;
        bVar3 = this->current <= *piVar1;
      }
      if (!bVar3) {
        this->error_message = "invalid string: ill-formed UTF-8 byte";
        return bVar6;
      }
      std::__cxx11::string::push_back(cVar5);
      piVar4 = piVar4 + 1;
      bVar6 = piVar4 == piVar2;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool next_byte_in_range(std::initializer_list<int> ranges)
    {
        assert(ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current and current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }